

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

int64_t hdr_count_at_index(hdr_histogram *h,int32_t index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (h->normalizing_index_offset != 0) {
    iVar3 = index - h->normalizing_index_offset;
    iVar1 = h->counts_len;
    iVar2 = 0;
    if (iVar1 <= iVar3) {
      iVar2 = -iVar1;
    }
    if (iVar3 < 0) {
      iVar2 = iVar1;
    }
    index = iVar3 + iVar2;
  }
  return h->counts[index];
}

Assistant:

static int32_t normalize_index(const struct hdr_histogram* h, int32_t index)
{
    int32_t normalized_index;
    int32_t adjustment = 0;
    if (h->normalizing_index_offset == 0)
    {
        return index;
    }

    normalized_index = index - h->normalizing_index_offset;

    if (normalized_index < 0)
    {
        adjustment = h->counts_len;
    }
    else if (normalized_index >= h->counts_len)
    {
        adjustment = -h->counts_len;
    }

    return normalized_index + adjustment;
}